

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

int If_Dec7SuppSize(word *t)

{
  int iVar;
  int iVar1;
  word c1 [2];
  word c0 [2];
  
  iVar1 = 0;
  for (iVar = 0; iVar != 7; iVar = iVar + 1) {
    If_Dec7Cofactor(t,iVar,0,c0);
    If_Dec7Cofactor(t,iVar,1,c1);
    if ((c0[0] != c1[0]) || (c0[1] != c1[1])) {
      iVar1 = iVar1 + 1;
    }
  }
  return iVar1;
}

Assistant:

static inline int If_Dec7SuppSize( word t[2] )
{
    word c0[2], c1[2];
    int v, Count = 0;
    for ( v = 0; v < 7; v++ )
    {
        If_Dec7Cofactor( t, v, 0, c0 );
        If_Dec7Cofactor( t, v, 1, c1 );
        if ( c0[0] != c1[0] || c0[1] != c1[1] )
            Count++;
    }
    return Count;
}